

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_soft.c
# Opt level: O0

void shader_texture_grad_any_first(uintptr_t state,int x1,int y,int left_minor,int left_major)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  uintptr_t in_RDI;
  int in_R8D;
  float fVar1;
  float fVar2;
  float cur_y;
  float cur_x;
  state_texture_grad_any_2d *s;
  
  shader_texture_solid_any_first(in_RDI,in_ESI,in_EDX,in_ECX,in_R8D);
  fVar1 = (float)in_ESI - *(float *)(in_RDI + 0x60);
  fVar2 = (float)in_EDX - *(float *)(in_RDI + 100);
  *(float *)(in_RDI + 8) =
       fVar1 * *(float *)(in_RDI + 0x78) + fVar2 * *(float *)(in_RDI + 0x88) +
       *(float *)(in_RDI + 0x98);
  *(float *)(in_RDI + 0xc) =
       fVar1 * *(float *)(in_RDI + 0x7c) + fVar2 * *(float *)(in_RDI + 0x8c) +
       *(float *)(in_RDI + 0x9c);
  *(float *)(in_RDI + 0x10) =
       fVar1 * *(float *)(in_RDI + 0x80) + fVar2 * *(float *)(in_RDI + 0x90) +
       *(float *)(in_RDI + 0xa0);
  *(float *)(in_RDI + 0x14) =
       fVar1 * *(float *)(in_RDI + 0x84) + fVar2 * *(float *)(in_RDI + 0x94) +
       *(float *)(in_RDI + 0xa4);
  *(float *)(in_RDI + 0xa8) = (float)in_ECX * *(float *)(in_RDI + 0x78) + *(float *)(in_RDI + 0x88);
  *(float *)(in_RDI + 0xac) = (float)in_ECX * *(float *)(in_RDI + 0x7c) + *(float *)(in_RDI + 0x8c);
  *(float *)(in_RDI + 0xb0) = (float)in_ECX * *(float *)(in_RDI + 0x80) + *(float *)(in_RDI + 0x90);
  *(float *)(in_RDI + 0xb4) = (float)in_ECX * *(float *)(in_RDI + 0x84) + *(float *)(in_RDI + 0x94);
  *(float *)(in_RDI + 0xb8) = (float)in_R8D * *(float *)(in_RDI + 0x78) + *(float *)(in_RDI + 0x88);
  *(float *)(in_RDI + 0xbc) = (float)in_R8D * *(float *)(in_RDI + 0x7c) + *(float *)(in_RDI + 0x8c);
  *(float *)(in_RDI + 0xc0) = (float)in_R8D * *(float *)(in_RDI + 0x80) + *(float *)(in_RDI + 0x90);
  *(float *)(in_RDI + 0xc4) = (float)in_R8D * *(float *)(in_RDI + 0x84) + *(float *)(in_RDI + 0x94);
  return;
}

Assistant:

static void shader_texture_grad_any_first(uintptr_t state, int x1, int y, int left_minor, int left_major)
{
   state_texture_grad_any_2d* s = (state_texture_grad_any_2d*)state;
   float cur_x;
   float cur_y;

   shader_texture_solid_any_first(state, x1, y, left_minor, left_major);

   cur_x = (float)x1 - s->solid.off_x;
   cur_y = (float)y - s->solid.off_y;

   s->solid.cur_color.r = cur_x * s->color_dx.r + cur_y * s->color_dy.r + s->color_const.r;
   s->solid.cur_color.g = cur_x * s->color_dx.g + cur_y * s->color_dy.g + s->color_const.g;
   s->solid.cur_color.b = cur_x * s->color_dx.b + cur_y * s->color_dy.b + s->color_const.b;
   s->solid.cur_color.a = cur_x * s->color_dx.a + cur_y * s->color_dy.a + s->color_const.a;

   s->minor_color.r = (float)left_minor * s->color_dx.r + s->color_dy.r;
   s->minor_color.g = (float)left_minor * s->color_dx.g + s->color_dy.g;
   s->minor_color.b = (float)left_minor * s->color_dx.b + s->color_dy.b;
   s->minor_color.a = (float)left_minor * s->color_dx.a + s->color_dy.a;

   s->major_color.r = (float)left_major * s->color_dx.r + s->color_dy.r;
   s->major_color.g = (float)left_major * s->color_dx.g + s->color_dy.g;
   s->major_color.b = (float)left_major * s->color_dx.b + s->color_dy.b;
   s->major_color.a = (float)left_major * s->color_dx.a + s->color_dy.a;
}